

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::rfind_lower(StringRef *this,StringRef Str)

{
  StringRef RHS;
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  StringRef local_a0;
  size_t local_90;
  size_t e;
  size_t i;
  size_t N;
  StringRef *this_local;
  StringRef Str_local;
  unsigned_long local_50;
  size_t local_48;
  size_t local_40;
  StringRef *local_38;
  undefined1 local_30 [16];
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  i = Str.Length;
  this_local = (StringRef *)Str.Data;
  if ((char *)this->Length < i) {
    Str_local.Length = 0xffffffffffffffff;
  }
  else {
    e = (this->Length - i) + 1;
    local_90 = 0;
    N = (size_t)this;
    Str_local.Data = (char *)i;
    do {
      if (e == local_90) {
        return 0xffffffffffffffff;
      }
      e = e - 1;
      local_48 = i;
      local_40 = e;
      local_38 = this;
      puVar2 = std::min<unsigned_long>(&local_40,&this->Length);
      local_40 = *puVar2;
      pcVar3 = this->Data + local_40;
      local_50 = this->Length - local_40;
      puVar2 = std::min<unsigned_long>(&local_48,&local_50);
      local_a0.Length = *puVar2;
      local_10 = local_30;
      RHS.Length = (size_t)Str_local.Data;
      RHS.Data = (char *)this_local;
      local_a0.Data = pcVar3;
      local_20 = local_a0.Length;
      local_18 = pcVar3;
      bVar1 = equals_lower(&local_a0,RHS);
    } while (!bVar1);
    Str_local.Length = e;
  }
  return Str_local.Length;
}

Assistant:

size_t StringRef::rfind_lower(StringRef Str) const {
  size_t N = Str.size();
  if (N > Length)
    return npos;
  for (size_t i = Length - N + 1, e = 0; i != e;) {
    --i;
    if (substr(i, N).equals_lower(Str))
      return i;
  }
  return npos;
}